

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::set_rate_limit
          (session_impl *this,peer_class_t c,int channel,int limit)

{
  peer_class *ppVar1;
  int iVar2;
  int limit_00;
  
  if ((uint)channel < 2) {
    ppVar1 = peer_class_pool::at(&this->m_classes,c);
    if (ppVar1 != (peer_class *)0x0) {
      iVar2 = 0x7ffffffe;
      if ((uint)limit < 0x7ffffffe) {
        iVar2 = limit;
      }
      limit_00 = 0;
      if (0 < limit) {
        limit_00 = iVar2;
      }
      bandwidth_channel::throttle
                ((bandwidth_channel *)(&ppVar1->priority + (ulong)(uint)channel * 3 + -7),limit_00);
      return;
    }
  }
  return;
}

Assistant:

void session_impl::set_rate_limit(peer_class_t c, int channel, int limit)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(limit >= -1);
		TORRENT_ASSERT(channel >= 0 && channel <= 1);

		if (channel < 0 || channel > 1) return;

		peer_class* pc = m_classes.at(c);
		if (pc == nullptr) return;
		if (limit <= 0) limit = 0;
		else limit = std::min(limit, std::numeric_limits<int>::max() - 1);
		pc->channel[channel].throttle(limit);
	}